

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newLhs,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldLhs)

{
  uint *puVar1;
  uint *puVar2;
  Status *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  Real RVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  bool bVar15;
  int iVar16;
  Status SVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  undefined8 *puVar19;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined8 local_408;
  long lStack_400;
  uint local_3f8 [11];
  undefined3 uStack_3cb;
  int iStack_3c8;
  undefined1 uStack_3c4;
  undefined8 local_3c0;
  cpp_dec_float<100U,_int,_void> local_3b8;
  cpp_dec_float<100U,_int,_void> local_368;
  Status *local_318;
  undefined8 uStack_310;
  cpp_dec_float<100U,_int,_void> local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  pSVar3 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data;
  pnVar4 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_3b8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[i].m_backend.data;
  local_3b8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x10);
  local_3b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_3b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x20);
  local_3b8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_3b8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x30);
  local_3b8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_3b8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  local_3b8.exp = pnVar4[i].m_backend.exp;
  local_3b8.neg = pnVar4[i].m_backend.neg;
  local_3b8.fpclass = pnVar4[i].m_backend.fpclass;
  local_3b8.prec_elem = pnVar4[i].m_backend.prec_elem;
  local_3c0._0_4_ = cpp_dec_float_finite;
  local_3c0._4_4_ = 0x10;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  lStack_400 = 0;
  local_3f8[0] = 0;
  local_3f8[1] = 0;
  local_3f8[2] = 0;
  local_3f8[3] = 0;
  local_3f8[4] = 0;
  local_3f8[5] = 0;
  local_3f8[6] = 0;
  local_3f8[7] = 0;
  local_3f8[8] = 0;
  local_3f8[9] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  uStack_3c4 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_408,0.0);
  switch(pSVar3[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if ((this->theRep == ROW) && ((this->theShift).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_368.fpclass = cpp_dec_float_finite;
      local_368.prec_elem = 0x10;
      local_368.data._M_elems[0] = 0;
      local_368.data._M_elems[1] = 0;
      local_368.data._M_elems[2] = 0;
      local_368.data._M_elems[3] = 0;
      local_368.data._M_elems[4] = 0;
      local_368.data._M_elems[5] = 0;
      local_368.data._M_elems[6] = 0;
      local_368.data._M_elems[7] = 0;
      local_368.data._M_elems[8] = 0;
      local_368.data._M_elems[9] = 0;
      local_368.data._M_elems[10] = 0;
      local_368.data._M_elems[0xb] = 0;
      local_368.data._M_elems[0xc] = 0;
      local_368.data._M_elems[0xd] = 0;
      local_368.data._M_elems._56_5_ = 0;
      local_368.data._M_elems[0xf]._1_3_ = 0;
      local_368.exp = 0;
      local_368.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_368,0.0);
      iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(this->theShift).m_backend,&local_368);
      if (0 < iVar16) {
        pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
        uVar7 = *(undefined8 *)((pcVar18->data)._M_elems + 2);
        uVar8 = *(undefined8 *)((pcVar18->data)._M_elems + 4);
        uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
        uVar10 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
        uVar11 = *(undefined8 *)((pcVar18->data)._M_elems + 10);
        uVar12 = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
        uVar13 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
        *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
             *(undefined8 *)(pcVar18->data)._M_elems;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar7;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar8;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar9;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) = uVar10;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 10) = uVar11;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xc) = uVar12;
        *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xe) = uVar13;
        (this->m_nonbasicValue).m_backend.exp = pcVar18->exp;
        (this->m_nonbasicValue).m_backend.neg = pcVar18->neg;
        iVar14 = pcVar18->prec_elem;
        (this->m_nonbasicValue).m_backend.fpclass = pcVar18->fpclass;
        (this->m_nonbasicValue).m_backend.prec_elem = iVar14;
        this->m_nonbasicValueUpToDate = false;
      }
    }
    SVar17 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(&this->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,i);
    pSVar3[i] = SVar17;
    break;
  case P_FIXED:
    local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newLhs->m_backend).data._M_elems;
    local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newLhs->m_backend).data._M_elems + 2)
    ;
    local_218.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 4);
    local_218.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 6);
    local_218.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 8);
    local_218.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 10);
    local_218.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 0xc);
    local_218.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 0xe);
    local_218.m_backend.exp = (newLhs->m_backend).exp;
    local_218.m_backend.neg = (newLhs->m_backend).neg;
    local_218.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_218.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    local_268.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
    local_268.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
    local_268.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
    local_268.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
    local_268.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
    local_268.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
    local_268.m_backend.data._M_elems[6] = local_3b8.data._M_elems[6];
    local_268.m_backend.data._M_elems[7] = local_3b8.data._M_elems[7];
    local_268.m_backend.data._M_elems[8] = local_3b8.data._M_elems[8];
    local_268.m_backend.data._M_elems[9] = local_3b8.data._M_elems[9];
    local_268.m_backend.data._M_elems[10] = local_3b8.data._M_elems[10];
    local_268.m_backend.data._M_elems[0xb] = local_3b8.data._M_elems[0xb];
    local_268.m_backend.data._M_elems[0xc] = local_3b8.data._M_elems[0xc];
    local_268.m_backend.data._M_elems[0xd] = local_3b8.data._M_elems[0xd];
    local_268.m_backend.data._M_elems[0xe] = local_3b8.data._M_elems[0xe];
    local_268.m_backend.data._M_elems[0xf] = local_3b8.data._M_elems[0xf];
    local_268.m_backend.exp = local_3b8.exp;
    local_268.m_backend.neg = local_3b8.neg;
    local_268.m_backend.fpclass = local_3b8.fpclass;
    local_268.m_backend.prec_elem = local_3b8.prec_elem;
    RVar6 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar15 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_218,&local_268,RVar6);
    if ((bVar15) && (pSVar3[i] = P_ON_UPPER, this->initialized == true)) {
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(undefined8 *)&pnVar4[i].m_backend.data;
      uVar8 = *(undefined8 *)((long)&pnVar4[i].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x10);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x20);
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x30);
      uVar13 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar5[i].m_backend.data + 0x30);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar13;
      puVar1 = (uint *)((long)&pnVar5[i].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar11;
      *(undefined8 *)(puVar1 + 2) = uVar12;
      puVar1 = (uint *)((long)&pnVar5[i].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar9;
      *(undefined8 *)(puVar1 + 2) = uVar10;
      *(undefined8 *)&pnVar5[i].m_backend.data = uVar7;
      *(undefined8 *)((long)&pnVar5[i].m_backend.data + 8) = uVar8;
      pnVar5[i].m_backend.exp = pnVar4[i].m_backend.exp;
      pnVar5[i].m_backend.neg = pnVar4[i].m_backend.neg;
      iVar14 = pnVar4[i].m_backend.prec_elem;
      pnVar5[i].m_backend.fpclass = pnVar4[i].m_backend.fpclass;
      pnVar5[i].m_backend.prec_elem = iVar14;
    }
    break;
  default:
    puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_368.data._M_elems._0_8_ = local_368.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"XCHANG03 This should never happen.","");
    *puVar19 = &PTR__SPxException_006a9ee8;
    puVar19[1] = puVar19 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar19 + 1),local_368.data._M_elems._0_8_,
               local_368.data._M_elems._0_8_ + local_368.data._M_elems._8_8_);
    *puVar19 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_318 = *(Status **)(in_FS_OFFSET + -8);
    uStack_310 = 0;
    local_368.fpclass = cpp_dec_float_finite;
    local_368.prec_elem = 0x10;
    local_368.data._M_elems[0] = 0;
    local_368.data._M_elems[1] = 0;
    local_368.data._M_elems[2] = 0;
    local_368.data._M_elems[3] = 0;
    local_368.data._M_elems[4] = 0;
    local_368.data._M_elems[5] = 0;
    local_368.data._M_elems[6] = 0;
    local_368.data._M_elems[7] = 0;
    local_368.data._M_elems[8] = 0;
    local_368.data._M_elems[9] = 0;
    local_368.data._M_elems[10] = 0;
    local_368.data._M_elems[0xb] = 0;
    local_368.data._M_elems[0xc] = 0;
    local_368.data._M_elems[0xd] = 0;
    local_368.data._M_elems._56_5_ = 0;
    local_368.data._M_elems[0xf]._1_3_ = 0;
    local_368.exp = 0;
    local_368.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_368,-(double)local_318);
    if ((((newLhs->m_backend).fpclass == cpp_dec_float_NaN) ||
        (local_368.fpclass == cpp_dec_float_NaN)) ||
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&newLhs->m_backend,&local_368), 0 < iVar16)) {
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newLhs->m_backend).data._M_elems;
      local_d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 2);
      local_d8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 4);
      local_d8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 6);
      local_d8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 8);
      local_d8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 10);
      local_d8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 0xc);
      local_d8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((newLhs->m_backend).data._M_elems + 0xe);
      local_d8.m_backend.exp = (newLhs->m_backend).exp;
      local_d8.m_backend.neg = (newLhs->m_backend).neg;
      local_d8.m_backend.fpclass = (newLhs->m_backend).fpclass;
      local_d8.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
      local_128.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
      local_128.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
      local_128.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
      local_128.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
      local_128.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
      local_128.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
      local_128.m_backend.data._M_elems[6] = local_3b8.data._M_elems[6];
      local_128.m_backend.data._M_elems[7] = local_3b8.data._M_elems[7];
      local_128.m_backend.data._M_elems[8] = local_3b8.data._M_elems[8];
      local_128.m_backend.data._M_elems[9] = local_3b8.data._M_elems[9];
      local_128.m_backend.data._M_elems[10] = local_3b8.data._M_elems[10];
      local_128.m_backend.data._M_elems[0xb] = local_3b8.data._M_elems[0xb];
      local_128.m_backend.data._M_elems[0xc] = local_3b8.data._M_elems[0xc];
      local_128.m_backend.data._M_elems[0xd] = local_3b8.data._M_elems[0xd];
      local_128.m_backend.data._M_elems[0xe] = local_3b8.data._M_elems[0xe];
      local_128.m_backend.data._M_elems[0xf] = local_3b8.data._M_elems[0xf];
      local_128.m_backend.exp = local_3b8.exp;
      local_128.m_backend.neg = local_3b8.neg;
      local_128.m_backend.fpclass = local_3b8.fpclass;
      local_128.m_backend.prec_elem = local_3b8.prec_elem;
      local_318 = pSVar3;
      RVar6 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      bVar15 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_d8,&local_128,RVar6);
      if (bVar15) {
        local_318[i] = P_FIXED;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar4 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar4 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 0x10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems[6] = 0;
      local_308.data._M_elems[7] = 0;
      local_308.data._M_elems[8] = 0;
      local_308.data._M_elems[9] = 0;
      local_308.data._M_elems[10] = 0;
      local_308.data._M_elems[0xb] = 0;
      local_308.data._M_elems[0xc] = 0;
      local_308.data._M_elems[0xd] = 0;
      local_308.data._M_elems._56_5_ = 0;
      local_308.data._M_elems[0xf]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_308,&newLhs->m_backend,&oldLhs->m_backend);
      local_368.fpclass = cpp_dec_float_finite;
      local_368.prec_elem = 0x10;
      local_368.data._M_elems[0] = 0;
      local_368.data._M_elems[1] = 0;
      local_368.data._M_elems[2] = 0;
      local_368.data._M_elems[3] = 0;
      local_368.data._M_elems[4] = 0;
      local_368.data._M_elems[5] = 0;
      local_368.data._M_elems[6] = 0;
      local_368.data._M_elems[7] = 0;
      local_368.data._M_elems[8] = 0;
      local_368.data._M_elems[9] = 0;
      local_368.data._M_elems[10] = 0;
      local_368.data._M_elems[0xb] = 0;
      local_368.data._M_elems[0xc] = 0;
      local_368.data._M_elems[0xd] = 0;
      local_368.data._M_elems._56_5_ = 0;
      local_368.data._M_elems[0xf]._1_3_ = 0;
      local_368.exp = 0;
      local_368.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_368,&pnVar4[i].m_backend,&local_308);
      local_408 = local_368.data._M_elems._0_8_;
      lStack_400 = local_368.data._M_elems._8_8_;
      local_3f8._0_8_ = local_368.data._M_elems._16_8_;
      local_3f8._8_8_ = local_368.data._M_elems._24_8_;
      local_3f8._16_8_ = local_368.data._M_elems._32_8_;
      local_3f8._24_8_ = local_368.data._M_elems._40_8_;
      local_3f8._32_8_ = local_368.data._M_elems._48_8_;
      unique0x1000356b = local_368.data._M_elems._56_5_;
      uStack_3cb = local_368.data._M_elems[0xf]._1_3_;
      iStack_3c8 = local_368.exp;
      uStack_3c4 = local_368.neg;
      local_3c0 = local_368._72_8_;
      break;
    }
    ::soplex::infinity::__tls_init();
    local_368.fpclass = cpp_dec_float_finite;
    local_368.prec_elem = 0x10;
    local_368.data._M_elems[0] = 0;
    local_368.data._M_elems[1] = 0;
    local_368.data._M_elems[2] = 0;
    local_368.data._M_elems[3] = 0;
    local_368.data._M_elems[4] = 0;
    local_368.data._M_elems[5] = 0;
    local_368.data._M_elems[6] = 0;
    local_368.data._M_elems[7] = 0;
    local_368.data._M_elems[8] = 0;
    local_368.data._M_elems[9] = 0;
    local_368.data._M_elems[10] = 0;
    local_368.data._M_elems[0xb] = 0;
    local_368.data._M_elems[0xc] = 0;
    local_368.data._M_elems[0xd] = 0;
    local_368.data._M_elems._56_5_ = 0;
    local_368.data._M_elems[0xf]._1_3_ = 0;
    local_368.exp = 0;
    local_368.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_368,(double)local_318);
    if (((local_3b8.fpclass == cpp_dec_float_NaN) || (local_368.fpclass == cpp_dec_float_NaN)) ||
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_3b8,&local_368), iVar16 < 0)) {
      pSVar3[i] = P_ON_UPPER;
      if ((this->m_nonbasicValueUpToDate == true) && (this->theRep == COLUMN)) {
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 0x10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems[6] = 0;
        local_308.data._M_elems[7] = 0;
        local_308.data._M_elems[8] = 0;
        local_308.data._M_elems[9] = 0;
        local_308.data._M_elems[10] = 0;
        local_308.data._M_elems[0xb] = 0;
        local_308.data._M_elems[0xc] = 0;
        local_308.data._M_elems[0xd] = 0;
        local_308.data._M_elems._56_5_ = 0;
        local_308.data._M_elems[0xf]._1_3_ = 0;
        local_308.exp = 0;
        local_308.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_308,
                   &(this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_3b8);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,
                   &(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldLhs->m_backend);
        local_368.fpclass = cpp_dec_float_finite;
        local_368.prec_elem = 0x10;
        local_368.data._M_elems[0] = 0;
        local_368.data._M_elems[1] = 0;
        local_368.data._M_elems[2] = 0;
        local_368.data._M_elems[3] = 0;
        local_368.data._M_elems[4] = 0;
        local_368.data._M_elems[5] = 0;
        local_368.data._M_elems[6] = 0;
        local_368.data._M_elems[7] = 0;
        local_368.data._M_elems[8] = 0;
        local_368.data._M_elems[9] = 0;
        local_368.data._M_elems[10] = 0;
        local_368.data._M_elems[0xb] = 0;
        local_368.data._M_elems[0xc] = 0;
        local_368.data._M_elems[0xd] = 0;
        local_368.data._M_elems._56_5_ = 0;
        local_368.data._M_elems[0xf]._1_3_ = 0;
        local_368.exp = 0;
        local_368.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_368,&local_308,&local_88);
        local_408 = local_368.data._M_elems._0_8_;
        lStack_400 = local_368.data._M_elems._8_8_;
        local_3f8._0_8_ = local_368.data._M_elems._16_8_;
        local_3f8._8_8_ = local_368.data._M_elems._24_8_;
        local_3f8._16_8_ = local_368.data._M_elems._32_8_;
        local_3f8._24_8_ = local_368.data._M_elems._40_8_;
        local_3f8._32_8_ = local_368.data._M_elems._48_8_;
        unique0x10003570 = local_368.data._M_elems._56_5_;
        uStack_3cb = local_368.data._M_elems[0xf]._1_3_;
        iStack_3c8 = local_368.exp;
        uStack_3c4 = local_368.neg;
        local_3c0 = local_368._72_8_;
      }
      break;
    }
    pSVar3[i] = P_FREE;
    if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
    pnVar4 = (this->theURbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_308.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[i].m_backend.data;
    local_308.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x10);
    local_308.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_308.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x20);
    local_308.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_308.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x30);
    local_308.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    local_308.data._M_elems._56_5_ = SUB85(uVar7,0);
    local_308.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_308.exp = pnVar4[i].m_backend.exp;
    local_308.neg = pnVar4[i].m_backend.neg;
    local_308.fpclass = pnVar4[i].m_backend.fpclass;
    local_308.prec_elem = pnVar4[i].m_backend.prec_elem;
    if (local_308.fpclass != cpp_dec_float_finite || local_308.data._M_elems[0] != 0) {
      local_308.neg = (bool)(local_308.neg ^ 1);
    }
    pcVar18 = &local_308;
    newLhs = oldLhs;
    goto LAB_00397079;
  case P_ON_UPPER:
    local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newLhs->m_backend).data._M_elems;
    local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newLhs->m_backend).data._M_elems + 2)
    ;
    local_178.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 4);
    local_178.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 6);
    local_178.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 8);
    local_178.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 10);
    local_178.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 0xc);
    local_178.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newLhs->m_backend).data._M_elems + 0xe);
    local_178.m_backend.exp = (newLhs->m_backend).exp;
    local_178.m_backend.neg = (newLhs->m_backend).neg;
    local_178.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_178.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    local_1c8.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
    local_1c8.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
    local_1c8.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
    local_1c8.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
    local_1c8.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
    local_1c8.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
    local_1c8.m_backend.data._M_elems[6] = local_3b8.data._M_elems[6];
    local_1c8.m_backend.data._M_elems[7] = local_3b8.data._M_elems[7];
    local_1c8.m_backend.data._M_elems[8] = local_3b8.data._M_elems[8];
    local_1c8.m_backend.data._M_elems[9] = local_3b8.data._M_elems[9];
    local_1c8.m_backend.data._M_elems[10] = local_3b8.data._M_elems[10];
    local_1c8.m_backend.data._M_elems[0xb] = local_3b8.data._M_elems[0xb];
    local_1c8.m_backend.data._M_elems[0xc] = local_3b8.data._M_elems[0xc];
    local_1c8.m_backend.data._M_elems[0xd] = local_3b8.data._M_elems[0xd];
    local_1c8.m_backend.data._M_elems[0xe] = local_3b8.data._M_elems[0xe];
    local_1c8.m_backend.data._M_elems[0xf] = local_3b8.data._M_elems[0xf];
    local_1c8.m_backend.exp = local_3b8.exp;
    local_1c8.m_backend.neg = local_3b8.neg;
    local_1c8.m_backend.fpclass = local_3b8.fpclass;
    local_1c8.m_backend.prec_elem = local_3b8.prec_elem;
    RVar6 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar15 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_178,&local_1c8,RVar6);
    if (bVar15) {
      pSVar3[i] = P_FIXED;
    }
    break;
  case P_FREE:
    ::soplex::infinity::__tls_init();
    local_368.fpclass = cpp_dec_float_finite;
    local_368.prec_elem = 0x10;
    local_368.data._M_elems[0] = 0;
    local_368.data._M_elems[1] = 0;
    local_368.data._M_elems[2] = 0;
    local_368.data._M_elems[3] = 0;
    local_368.data._M_elems[4] = 0;
    local_368.data._M_elems[5] = 0;
    local_368.data._M_elems[6] = 0;
    local_368.data._M_elems[7] = 0;
    local_368.data._M_elems[8] = 0;
    local_368.data._M_elems[9] = 0;
    local_368.data._M_elems[10] = 0;
    local_368.data._M_elems[0xb] = 0;
    local_368.data._M_elems[0xc] = 0;
    local_368.data._M_elems[0xd] = 0;
    local_368.data._M_elems._56_5_ = 0;
    local_368.data._M_elems[0xf]._1_3_ = 0;
    local_368.exp = 0;
    local_368.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_368,-*(double *)(in_FS_OFFSET + -8));
    if (((((newLhs->m_backend).fpclass == cpp_dec_float_NaN) ||
         (local_368.fpclass == cpp_dec_float_NaN)) ||
        (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&newLhs->m_backend,&local_368), iVar16 < 1)) ||
       ((pSVar3[i] = P_ON_LOWER, this->m_nonbasicValueUpToDate != true || (this->theRep != COLUMN)))
       ) break;
    pcVar18 = &(this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
LAB_00397079:
    local_368.neg = false;
    local_368.exp = 0;
    local_368.data._M_elems[0xf]._1_3_ = 0;
    local_368.data._M_elems._56_5_ = 0;
    local_368.fpclass = cpp_dec_float_finite;
    local_368.prec_elem = 0x10;
    local_368.data._M_elems[0xc] = 0;
    local_368.data._M_elems[0xd] = 0;
    local_368.data._M_elems[10] = 0;
    local_368.data._M_elems[0xb] = 0;
    local_368.data._M_elems[8] = 0;
    local_368.data._M_elems[9] = 0;
    local_368.data._M_elems[6] = 0;
    local_368.data._M_elems[7] = 0;
    local_368.data._M_elems[4] = 0;
    local_368.data._M_elems[5] = 0;
    local_368.data._M_elems[2] = 0;
    local_368.data._M_elems[3] = 0;
    local_368.data._M_elems[0] = 0;
    local_368.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_368,pcVar18,&newLhs->m_backend);
    local_408 = local_368.data._M_elems._0_8_;
    lStack_400 = local_368.data._M_elems._8_8_;
    local_3f8._0_8_ = local_368.data._M_elems._16_8_;
    local_3f8._8_8_ = local_368.data._M_elems._24_8_;
    local_3f8._16_8_ = local_368.data._M_elems._32_8_;
    local_3f8._24_8_ = local_368.data._M_elems._40_8_;
    local_3f8._32_8_ = local_368.data._M_elems._48_8_;
    unique0x10003566 = local_368.data._M_elems._56_5_;
    uStack_3cb = local_368.data._M_elems[0xf]._1_3_;
    iStack_3c8 = local_368.exp;
    uStack_3c4 = local_368.neg;
    local_3c0 = local_368._72_8_;
  }
  if (this->theRep == COLUMN) {
    local_2b8.m_backend.data._M_elems[0xf]._1_3_ = uStack_3cb;
    local_2b8.m_backend.data._M_elems._56_5_ = stack0xfffffffffffffc30;
    local_2b8.m_backend.data._M_elems[0xc] = local_3f8[8];
    local_2b8.m_backend.data._M_elems[0xd] = local_3f8[9];
    local_2b8.m_backend.data._M_elems[8] = local_3f8[4];
    local_2b8.m_backend.data._M_elems[9] = local_3f8[5];
    local_2b8.m_backend.data._M_elems[10] = local_3f8[6];
    local_2b8.m_backend.data._M_elems[0xb] = local_3f8[7];
    local_2b8.m_backend.data._M_elems[4] = local_3f8[0];
    local_2b8.m_backend.data._M_elems[5] = local_3f8[1];
    local_2b8.m_backend.data._M_elems[6] = local_3f8[2];
    local_2b8.m_backend.data._M_elems[7] = local_3f8[3];
    local_2b8.m_backend.data._M_elems[0] = (uint)local_408;
    local_2b8.m_backend.data._M_elems[1] = local_408._4_4_;
    local_2b8.m_backend.data._M_elems[2] = (undefined4)lStack_400;
    local_2b8.m_backend.data._M_elems[3] = lStack_400._4_4_;
    local_2b8.m_backend.exp = iStack_3c8;
    local_2b8.m_backend.neg = (bool)uStack_3c4;
    local_2b8.m_backend.fpclass = (fpclass_type)local_3c0;
    local_2b8.m_backend.prec_elem = local_3c0._4_4_;
    updateNonbasicValue(this,&local_2b8);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhsStatus(int i, R newLhs, R oldLhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currRhs   = this->rhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG03 changeLhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newLhs <= R(-infinity))
      {
         if(currRhs >= R(infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theURbound[i] * oldLhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theLRbound[i] * currRhs) - (theURbound[i] * oldLhs);
         }
      }
      else if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newLhs - oldLhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theURbound[i] * (newLhs - oldLhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newLhs > R(-infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theURbound[i] * newLhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(isInitialized())
            theLRbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG03 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}